

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

bool __thiscall
UdpSocketImpl::RemoveFromMulticastGroup
          (UdpSocketImpl *this,char *szMulticastIp,char *szInterfaceIp,uint32_t nInterfaceIndex)

{
  int iVar1;
  int *piVar2;
  undefined1 local_5c [4];
  undefined1 auStack_58 [4];
  ip_mreq mreq_1;
  ipv6_mreq mreq;
  uint32_t AnyAddr;
  int iAddFamily;
  addrinfo *lstAddr;
  char *pcStack_28;
  uint32_t nInterfaceIndex_local;
  char *szInterfaceIp_local;
  char *szMulticastIp_local;
  UdpSocketImpl *this_local;
  
  lstAddr._4_4_ = nInterfaceIndex;
  pcStack_28 = szInterfaceIp;
  szInterfaceIp_local = szMulticastIp;
  szMulticastIp_local = (char *)this;
  iVar1 = getaddrinfo(szMulticastIp,(char *)0x0,(addrinfo *)0x0,(addrinfo **)&AnyAddr);
  if (iVar1 == 0) {
    mreq.ipv6mr_interface = _AnyAddr->ai_family;
    freeaddrinfo(_AnyAddr);
    mreq.ipv6mr_multiaddr.__in6_u.__u6_addr32[3] = 0;
    if (mreq.ipv6mr_interface == 10) {
      memset(&mreq_1,0,0x14);
      inet_pton(10,szInterfaceIp_local,&mreq_1);
      mreq.ipv6mr_multiaddr.__in6_u.__u6_addr32[2] = lstAddr._4_4_;
      iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0x29,0x15,&mreq_1,0x14);
      if ((iVar1 != 0) ||
         (iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0x29,0x11,
                             (void *)((long)&mreq.ipv6mr_multiaddr.__in6_u + 0xc),4), iVar1 != 0)) {
        piVar2 = __errno_location();
        (this->super_BaseSocketImpl).m_iError = *piVar2;
        (this->super_BaseSocketImpl).m_iErrLoc = 3;
        return false;
      }
    }
    else {
      memset(local_5c,0,8);
      inet_pton(2,szInterfaceIp_local,local_5c);
      inet_pton(2,pcStack_28,auStack_58);
      iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0,0x24,local_5c,8);
      if ((iVar1 != 0) ||
         (iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0,0x20,
                             (void *)((long)&mreq.ipv6mr_multiaddr.__in6_u + 0xc),4), iVar1 != 0)) {
        piVar2 = __errno_location();
        (this->super_BaseSocketImpl).m_iError = *piVar2;
        (this->super_BaseSocketImpl).m_iErrLoc = 3;
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool UdpSocketImpl::RemoveFromMulticastGroup(const char* const szMulticastIp, const char* const szInterfaceIp, uint32_t nInterfaceIndex) noexcept
#endif
{
    struct addrinfo *lstAddr;
    if (::getaddrinfo(szMulticastIp, nullptr, nullptr, &lstAddr) != 0)
        return false;
    const int iAddFamily = lstAddr->ai_family;
    ::freeaddrinfo(lstAddr);

    constexpr uint32_t AnyAddr = INADDR_ANY;

    if (iAddFamily == AF_INET6)
    {
        ipv6_mreq mreq{IN6ADDR_ANY_INIT, 0};
        inet_pton(AF_INET6, szMulticastIp, &mreq.ipv6mr_multiaddr);
        mreq.ipv6mr_interface = nInterfaceIndex; // use default

        if (::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_DROP_MEMBERSHIP, reinterpret_cast<char*>(&mreq), sizeof(mreq)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_MULTICAST_IF, reinterpret_cast<const char*>(&AnyAddr), sizeof(uint32_t)) != 0)
        {
            m_iError = WSAGetLastError();
            m_iErrLoc = 3;
            return false;
        }
    }
    else
    {
        ip_mreq mreq{{0},{0}};
        inet_pton(AF_INET, szMulticastIp, &mreq.imr_multiaddr.s_addr);
#if defined(_WIN32) || defined(_WIN64)
        mreq.imr_interface.s_addr = htonl(nInterfaceIndex);
#else
        inet_pton(AF_INET, szInterfaceIp, &mreq.imr_interface.s_addr);
#endif

        if (setsockopt(m_fSock, IPPROTO_IP, IP_DROP_MEMBERSHIP, reinterpret_cast<char *>(&mreq), sizeof(mreq)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IP, IP_MULTICAST_IF, reinterpret_cast<const char*>(&AnyAddr), sizeof(uint32_t)) != 0)
        {
            m_iError = WSAGetLastError();
            m_iErrLoc = 3;
            return false;
        }
    }

    return true;
}